

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  int iVar1;
  int iVar2;
  uchar *scratch;
  long lVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *puVar6;
  bool bVar7;
  byte bVar8;
  char buffer [128];
  char header [66];
  char local_f8 [128];
  undefined8 local_78 [8];
  undefined2 local_38;
  
  bVar8 = 0;
  iVar1 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    scratch = (uchar *)malloc((ulong)(uint)(x * 4));
    pcVar5 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    puVar6 = local_78;
    for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *(undefined8 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 8;
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    }
    local_38 = 10;
    (*s->func)(s->context,local_78,0x41);
    iVar4 = 0;
    iVar1 = sprintf(local_f8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    (*s->func)(s->context,local_f8,iVar1);
    iVar1 = y + -1;
    do {
      iVar2 = iVar1;
      if (stbi__flip_vertically_on_write == 0) {
        iVar2 = iVar4;
      }
      stbiw__write_hdr_scanline(s,x,comp,scratch,data + iVar2 * x * comp * x);
      iVar4 = iVar4 + 1;
      bVar7 = iVar1 != 0;
      iVar1 = iVar1 + -1;
    } while (bVar7);
    free(scratch);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef STBI_MSC_SECURE_CRT
      len = sprintf_s(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i)*x);
      STBIW_FREE(scratch);
      return 1;
   }
}